

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# nvrm_decode_ioctl.c
# Opt level: O2

void decode_nvrm_ioctl_create_drv_obj(nvrm_ioctl_create_drv_obj *s)

{
  uint uVar1;
  uint32_t status;
  FILE *__stream;
  int iVar2;
  char *pcVar3;
  
  uVar1 = s->cid;
  if (uVar1 == 0) {
    iVar2 = _nvrm_field_enabled("cid");
    if (iVar2 != 0) goto LAB_00259dcb;
  }
  else {
LAB_00259dcb:
    fprintf(_stdout,"%scid: 0x%08x",nvrm_pfx,(ulong)uVar1);
  }
  pcVar3 = nvrm_sep;
  nvrm_pfx = nvrm_sep;
  uVar1 = s->handle;
  if (uVar1 == 0) {
    iVar2 = _nvrm_field_enabled("handle");
    if (iVar2 != 0) goto LAB_00259e11;
  }
  else {
LAB_00259e11:
    fprintf(_stdout,"%shandle: 0x%08x",pcVar3,(ulong)uVar1);
    nvrm_pfx = nvrm_sep;
    describe_nvrm_object(s->cid,s->handle,"handle");
    pcVar3 = nvrm_pfx;
  }
  fprintf(_stdout,"%sclass: 0x%04x",pcVar3,(ulong)s->cls);
  pcVar3 = nvrm_get_class_name(s->cls);
  if (pcVar3 != (char *)0x0) {
    fprintf(_stdout," [%s]",pcVar3);
  }
  pcVar3 = nvrm_sep;
  nvrm_pfx = nvrm_sep;
  uVar1 = s->parent;
  if (uVar1 == 0) {
    iVar2 = _nvrm_field_enabled("parent");
    if (iVar2 != 0) goto LAB_00259eba;
  }
  else {
LAB_00259eba:
    fprintf(_stdout,"%sparent: 0x%08x",pcVar3,(ulong)uVar1);
    nvrm_pfx = nvrm_sep;
    describe_nvrm_object(s->cid,s->parent,"parent");
  }
  status = s->status;
  if (status == 0) {
    iVar2 = _nvrm_field_enabled("status");
    if (iVar2 == 0) goto LAB_00259f34;
  }
  __stream = _stdout;
  pcVar3 = nvrm_pfx;
  nvrm_status(status);
  fprintf(__stream,"%sstatus: %s",pcVar3,nvrm_status::buf);
LAB_00259f34:
  nvrm_pfx = nvrm_sep;
  fputc(10,_stdout);
  if (mmt_sync_fd != -1) {
    fflush(_stdout);
    return;
  }
  return;
}

Assistant:

static void decode_nvrm_ioctl_create_drv_obj(struct nvrm_ioctl_create_drv_obj *s)
{
	nvrm_print_cid(s, cid);
	nvrm_print_handle(s, handle, cid);
	nvrm_print_class(s, cls);
	nvrm_print_handle(s, parent, cid);
	nvrm_print_status(s, status);
	nvrm_print_ln();
}